

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_adcw(uint16_t dst,uint16_t src1,uint16_t src3)

{
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  target_long tVar4;
  target_long tVar5;
  uint16_t src2;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint16_t src3_local;
  uint16_t src1_local;
  uint16_t dst_local;
  
  uVar3 = (dst - src1) - src3;
  if (src3 == 0) {
    bVar2 = dst < src1;
  }
  else {
    bVar2 = dst <= src1;
  }
  bVar1 = "\x04"[(byte)dst];
  tVar4 = lshift((ulong)dst,-8);
  tVar5 = lshift((long)(int)(((src1 ^ uVar3) ^ 0xffffffff) & (uint)(src1 ^ dst)),-4);
  return (uint)(bVar2 | bVar1) | (ushort)(dst ^ src1 ^ uVar3) & 0x10 | (uint)(dst == 0) << 6 |
         (uint)tVar4 & 0x80 | (uint)tVar5 & 0x800;
}

Assistant:

static int glue(compute_all_adc, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1,
                                         DATA_TYPE src3)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src2 = dst - src1 - src3;

    cf = (src3 ? dst <= src1 : dst < src1);
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & 0x10;
    zf = (dst == 0) << 6;
    sf = lshift(dst, 8 - DATA_BITS) & 0x80;
    of = lshift((src1 ^ src2 ^ -1) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}